

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O1

OPJ_BOOL bmp_read_rle8_data(FILE *IN,OPJ_UINT8 *pData,OPJ_UINT32 stride,OPJ_UINT32 width,
                           OPJ_UINT32 height)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  OPJ_UINT8 *pOVar5;
  int iVar6;
  OPJ_UINT8 *pOVar7;
  uint uVar8;
  OPJ_UINT8 *pOVar9;
  OPJ_UINT8 *__s;
  OPJ_UINT8 *pOVar10;
  OPJ_UINT8 *pOVar11;
  uint local_6c;
  int local_5c;
  
  pOVar5 = pData + height * stride;
  iVar6 = 0;
  local_6c = 0;
  uVar8 = 0;
  __s = pData;
  do {
    if (height <= local_6c) goto LAB_0010b3ab;
    iVar2 = getc((FILE *)IN);
    local_5c = 1;
    if (iVar2 != -1) {
      if (iVar2 == 0) {
        uVar3 = getc((FILE *)IN);
        switch(uVar3) {
        case 0:
          local_6c = local_6c + 1;
          __s = pData + local_6c * stride;
          uVar8 = 0;
LAB_0010b2ad:
          local_5c = 0;
          break;
        case 1:
          local_5c = 3;
        case 0xffffffff:
          break;
        case 2:
          iVar2 = getc((FILE *)IN);
          if (iVar2 != -1) {
            uVar8 = iVar2 + uVar8;
            iVar2 = getc((FILE *)IN);
            if (iVar2 != -1) {
              local_6c = local_6c + iVar2;
              __s = pData + (ulong)(local_6c * stride) + (ulong)uVar8;
              goto LAB_0010b2ad;
            }
          }
          break;
        default:
          if (((0 < (int)uVar3) && (uVar8 < width)) && (__s < pOVar5)) {
            iVar2 = 1;
            do {
              iVar4 = getc((FILE *)IN);
              if (iVar4 == -1) {
                bVar1 = false;
                goto LAB_0010b396;
              }
              *__s = (OPJ_UINT8)iVar4;
              iVar6 = iVar6 + 1;
              uVar8 = uVar8 + 1;
              __s = __s + 1;
            } while (((iVar2 < (int)uVar3) && (uVar8 < width)) && (iVar2 = iVar2 + 1, __s < pOVar5))
            ;
          }
          if (((uVar3 & 1) == 0) || (iVar2 = getc((FILE *)IN), iVar2 != -1)) {
            bVar1 = true;
          }
          else {
            bVar1 = false;
          }
LAB_0010b396:
          if (bVar1) goto LAB_0010b2ad;
        }
      }
      else {
        iVar4 = getc((FILE *)IN);
        if ((((iVar4 != -1) && (0 < iVar2)) && (uVar8 < width)) && (__s < pOVar5)) {
          pOVar10 = pOVar5 + ~(ulong)__s;
          pOVar9 = (OPJ_UINT8 *)(ulong)(~uVar8 + width);
          pOVar7 = pOVar9;
          if (pOVar10 < pOVar9) {
            pOVar7 = pOVar10;
          }
          pOVar11 = (OPJ_UINT8 *)(ulong)(iVar2 - 1);
          if (pOVar11 <= pOVar7) {
            pOVar7 = pOVar11;
          }
          memset(__s,iVar4,(size_t)(pOVar7 + 1));
          if (pOVar9 <= pOVar10) {
            pOVar10 = pOVar9;
          }
          if (pOVar11 <= pOVar10) {
            pOVar10 = pOVar11;
          }
          iVar6 = iVar6 + 1 + (int)pOVar10;
          uVar8 = uVar8 + (int)pOVar10 + 1;
          __s = __s + (long)pOVar10 + 1;
        }
        if (iVar4 != -1) goto LAB_0010b2ad;
      }
    }
  } while (local_5c == 0);
  if (local_5c == 3) {
LAB_0010b3ab:
    if (iVar6 == height * width) {
      return 1;
    }
    bmp_read_rle8_data_cold_1();
  }
  return 0;
}

Assistant:

static OPJ_BOOL bmp_read_rle8_data(FILE* IN, OPJ_UINT8* pData,
                                   OPJ_UINT32 stride, OPJ_UINT32 width, OPJ_UINT32 height)
{
    OPJ_UINT32 x, y, written;
    OPJ_UINT8 *pix;
    const OPJ_UINT8 *beyond;

    beyond = pData + stride * height;
    pix = pData;

    x = y = written = 0U;
    while (y < height) {
        int c = getc(IN);
        if (c == EOF) {
            return OPJ_FALSE;
        }

        if (c) {
            int j, c1_int;
            OPJ_UINT8 c1;

            c1_int = getc(IN);
            if (c1_int == EOF) {
                return OPJ_FALSE;
            }
            c1 = (OPJ_UINT8)c1_int;

            for (j = 0; (j < c) && (x < width) &&
                    ((OPJ_SIZE_T)pix < (OPJ_SIZE_T)beyond); j++, x++, pix++) {
                *pix = c1;
                written++;
            }
        } else {
            c = getc(IN);
            if (c == EOF) {
                return OPJ_FALSE;
            }

            if (c == 0x00) { /* EOL */
                x = 0;
                ++y;
                pix = pData + y * stride + x;
            } else if (c == 0x01) { /* EOP */
                break;
            } else if (c == 0x02) { /* MOVE by dxdy */
                c = getc(IN);
                if (c == EOF) {
                    return OPJ_FALSE;
                }
                x += (OPJ_UINT32)c;
                c = getc(IN);
                if (c == EOF) {
                    return OPJ_FALSE;
                }
                y += (OPJ_UINT32)c;
                pix = pData + y * stride + x;
            } else { /* 03 .. 255 */
                int j;
                for (j = 0; (j < c) && (x < width) &&
                        ((OPJ_SIZE_T)pix < (OPJ_SIZE_T)beyond); j++, x++, pix++) {
                    int c1_int;
                    OPJ_UINT8 c1;
                    c1_int = getc(IN);
                    if (c1_int == EOF) {
                        return OPJ_FALSE;
                    }
                    c1 = (OPJ_UINT8)c1_int;
                    *pix = c1;
                    written++;
                }
                if ((OPJ_UINT32)c & 1U) { /* skip padding byte */
                    c = getc(IN);
                    if (c == EOF) {
                        return OPJ_FALSE;
                    }
                }
            }
        }
    }/* while() */

    if (written != width * height) {
        fprintf(stderr, "warning, image's actual size does not match advertized one\n");
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}